

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApprovalTestNamer.cpp
# Opt level: O0

string * __thiscall
ApprovalTests::ApprovalTestNamer::getApprovalsSubdirectory_abi_cxx11_(ApprovalTestNamer *this)

{
  ulong uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  string *in_RDI;
  string *sub_directory;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_68 [32];
  string local_48 [55];
  undefined1 local_11;
  
  local_11 = 0;
  ::std::__cxx11::string::string((string *)in_RDI);
  testConfiguration();
  uVar1 = ::std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    __rhs = &testConfiguration()->subdirectory;
    __lhs = __rhs;
    SystemUtils::getDirectorySeparator_abi_cxx11_();
    ::std::operator+(__lhs,__rhs);
    ::std::__cxx11::string::operator=((string *)in_RDI,local_48);
    ::std::__cxx11::string::~string(local_48);
    ::std::__cxx11::string::~string(local_68);
  }
  return in_RDI;
}

Assistant:

std::string ApprovalTestNamer::getApprovalsSubdirectory() const
    {
        std::string sub_directory;
        if (!testConfiguration().subdirectory.empty())
        {
            sub_directory =
                testConfiguration().subdirectory + SystemUtils::getDirectorySeparator();
        }
        return sub_directory;
    }